

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O2

int Gia_ManToBridgeAbsNetlist(FILE *pFile,void *p,int pkg_type)

{
  Vec_Str_t *p_00;
  
  p_00 = Gia_ManToBridgeVec((Gia_Man_t *)p);
  Gia_CreateHeader(pFile,pkg_type,p_00->nSize,(uchar *)p_00->pArray);
  Vec_StrFree(p_00);
  return 1;
}

Assistant:

int Gia_ManToBridgeAbsNetlist( FILE * pFile, void * p, int pkg_type )
{
    Vec_Str_t * vBuffer;
    vBuffer = Gia_ManToBridgeVec( (Gia_Man_t *)p );
    Gia_CreateHeader( pFile, pkg_type, Vec_StrSize(vBuffer), (unsigned char *)Vec_StrArray(vBuffer) );
    Vec_StrFree( vBuffer );
    return 1;
}